

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O2

double __thiscall
HighsLinearSumBounds::getResidualSumUpper
          (HighsLinearSumBounds *this,HighsInt sum,HighsInt var,double coefficient)

{
  int iVar1;
  pointer pHVar2;
  double *pdVar3;
  double dVar4;
  HighsCDouble HVar5;
  
  iVar1 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[sum];
  if (iVar1 == 1) {
    if (coefficient <= 0.0) {
      if (this->implVarLowerSource[var] == sum) {
        dVar4 = this->varLower[var];
      }
      else {
        dVar4 = this->varLower[var];
        if (this->varLower[var] <= this->implVarLower[var]) {
          dVar4 = this->implVarLower[var];
        }
      }
      if (-INFINITY < dVar4) {
        return INFINITY;
      }
    }
    else {
      if (this->implVarUpperSource[var] == sum) {
        dVar4 = this->varUpper[var];
      }
      else {
        dVar4 = this->varUpper[var];
        if (this->implVarUpper[var] <= this->varUpper[var]) {
          dVar4 = this->implVarUpper[var];
        }
      }
      if (dVar4 < INFINITY) {
        return INFINITY;
      }
    }
    pHVar2 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    return pHVar2[sum].hi + pHVar2[sum].lo;
  }
  if (iVar1 != 0) {
    return INFINITY;
  }
  if (coefficient <= 0.0) {
    if (this->implVarLowerSource[var] != sum) {
      dVar4 = this->varLower[var];
      if (this->varLower[var] <= this->implVarLower[var]) {
        dVar4 = this->implVarLower[var];
      }
      goto LAB_0035e799;
    }
    pdVar3 = this->varLower;
  }
  else {
    if (this->implVarUpperSource[var] != sum) {
      dVar4 = this->varUpper[var];
      if (this->implVarUpper[var] <= this->varUpper[var]) {
        dVar4 = this->implVarUpper[var];
      }
      goto LAB_0035e799;
    }
    pdVar3 = this->varUpper;
  }
  dVar4 = pdVar3[var];
LAB_0035e799:
  HVar5 = HighsCDouble::operator-
                    ((this->sumUpper).
                     super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                     super__Vector_impl_data._M_start + sum,dVar4 * coefficient);
  return HVar5.lo + HVar5.hi;
}

Assistant:

double HighsLinearSumBounds::getResidualSumUpper(HighsInt sum, HighsInt var,
                                                 double coefficient) const {
  switch (numInfSumUpper[sum]) {
    case 0:
      if (coefficient > 0) {
        double vUpper = implVarUpperSource[var] == sum
                            ? varUpper[var]
                            : std::min(implVarUpper[var], varUpper[var]);
        return double(sumUpper[sum] - vUpper * coefficient);
      } else {
        double vLower = implVarLowerSource[var] == sum
                            ? varLower[var]
                            : std::max(implVarLower[var], varLower[var]);
        return double(sumUpper[sum] - vLower * coefficient);
      }
      break;
    case 1:
      if (coefficient > 0) {
        double vUpper = implVarUpperSource[var] == sum
                            ? varUpper[var]
                            : std::min(implVarUpper[var], varUpper[var]);
        return vUpper == kHighsInf ? double(sumUpper[sum]) : kHighsInf;
      } else {
        double vLower = implVarLowerSource[var] == sum
                            ? varLower[var]
                            : std::max(implVarLower[var], varLower[var]);
        return vLower == -kHighsInf ? double(sumUpper[sum]) : kHighsInf;
      }
      break;
    default:
      return kHighsInf;
  }
}